

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O3

void P_PlayerOnSpecial3DFloor(player_t *player)

{
  double dVar1;
  APlayerPawn *pAVar2;
  extsector_t *peVar3;
  long *plVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  int floorType;
  ulong uVar8;
  long lVar9;
  double dVar10;
  
  pAVar2 = player->mo;
  peVar3 = ((pAVar2->super_AActor).Sector)->e;
  uVar8 = (ulong)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  if (uVar8 != 0) {
    lVar9 = 0;
    do {
      plVar4 = *(long **)((long)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                         + lVar9);
      if ((*(uint *)(plVar4 + 0xb) & 0x200001) == 1) {
        pdVar5 = (double *)plVar4[5];
        dVar6 = (pAVar2->super_AActor).__Pos.X;
        dVar7 = (pAVar2->super_AActor).__Pos.Y;
        dVar10 = (dVar7 * pdVar5[1] + *pdVar5 * dVar6 + pdVar5[3]) * pdVar5[4];
        dVar1 = (pAVar2->super_AActor).__Pos.Z;
        if ((*(uint *)(plVar4 + 0xb) & 2) == 0) {
          if ((dVar1 <= dVar10) &&
             (pdVar5 = (double *)*plVar4,
             (dVar7 * pdVar5[1] + pdVar5[3] + dVar6 * *pdVar5) * pdVar5[4] <=
             dVar1 + (pAVar2->super_AActor).Height)) {
LAB_004fcf43:
            P_PlayerInSpecialSector(player,(sector_t *)plVar4[0xd]);
            floorType = sector_t::GetTerrain((sector_t *)plVar4[0xd],(int)plVar4[8]);
            P_PlayerOnSpecialFlat(player,floorType);
            return;
          }
        }
        else if ((dVar1 == dVar10) && (!NAN(dVar1) && !NAN(dVar10))) goto LAB_004fcf43;
      }
      lVar9 = lVar9 + 8;
    } while (uVar8 << 3 != lVar9);
  }
  return;
}

Assistant:

void P_PlayerOnSpecial3DFloor(player_t* player)
{
	for(auto rover : player->mo->Sector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_EXISTS)) continue;
		if (rover->flags & FF_FIX) continue;

		// Check the 3D floor's type...
		if(rover->flags & FF_SOLID)
		{
			// Player must be on top of the floor to be affected...
			if(player->mo->Z() != rover->top.plane->ZatPoint(player->mo)) continue;
		}
		else
		{
			//Water and DEATH FOG!!! heh
			if (player->mo->Z() > rover->top.plane->ZatPoint(player->mo) || 
				player->mo->Top() < rover->bottom.plane->ZatPoint(player->mo))
				continue;
		}

		// Apply sector specials
		P_PlayerInSpecialSector(player, rover->model);

		// Apply flat specials (using the ceiling!)
		P_PlayerOnSpecialFlat(
			player, rover->model->GetTerrain(rover->top.isceiling));

		break;
	}
}